

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::RecordIntConstant(FunctionBody *this,RegSlot location,uint val)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  Var var;
  double value;
  
  if ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->config).
       threadConfig)->m_Force32BitByteCode == true) && (0x7ffffffe < val + 0x3fffffff)) {
    value = (double)(int)val;
    uVar3 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(value);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(value);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
    }
    var = (Var)(uVar3 ^ 0xfffc000000000000);
  }
  else {
    var = (Var)((ulong)val | 0x1000000000000);
  }
  RecordConstant(this,location,var);
  return;
}

Assistant:

void FunctionBody::RecordIntConstant(RegSlot location, unsigned int val)
    {
        ScriptContext *scriptContext = this->GetScriptContext();
#ifdef ENABLE_TEST_HOOKS
        Var intConst = scriptContext->GetConfig()->Force32BitByteCode() ?
            JavascriptNumber::ToVarFor32BitBytecode((int32)val, scriptContext) :
            JavascriptNumber::ToVar((int32)val, scriptContext);
#else
        Var intConst = JavascriptNumber::ToVar((int32)val, scriptContext);
#endif
        this->RecordConstant(location, intConst);
    }